

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O3

void bsp_get_tag(bsp_size_t *status,void *tag)

{
  size_t __n;
  pointer ppVar1;
  pointer ppVar2;
  ulong uVar3;
  Bsmp *pBVar4;
  ulong uVar5;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_get_tag: can only be called within SPMD section\n");
  }
  if (status == (bsp_size_t *)0x0) {
    bsp_abort("bsp_get_tag: first arguments may not be NULL\n");
  }
  __n = s_bsmp->m_recv_tag_size;
  if (__n != 0 && tag == (void *)0x0) {
    bsp_abort("bsp_get_tag: tag must point to a block of available memory of at least %zu bytes long\n"
              ,__n);
  }
  pBVar4 = s_bsmp;
  ppVar1 = (s_bsmp->m_payloads).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (s_bsmp->m_payloads).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar1 != ppVar2) {
    *status = (bsp_size_t)ppVar2[-1].second;
    uVar3 = (pBVar4->m_tag_buffer).m_alignment;
    uVar5 = (pBVar4->m_recv_tag_size + uVar3) - 1;
    memcpy(tag,(void *)((uVar5 - uVar5 % uVar3) * (((long)ppVar2 - (long)ppVar1 >> 4) + -1) +
                       (long)(pBVar4->m_tag_buffer).m_aligned_ptr),__n);
    return;
  }
  *status = -1;
  return;
}

Assistant:

void bsp_get_tag( bsp_size_t * status, void * tag )
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_get_tag: can only be called within SPMD section\n");
#ifdef PROFILE
    TicToc t( TicToc::BSMP, s_bsmp->recv_tag_size() );
#endif

    if ( status == NULL )
        bsp_abort("bsp_get_tag: first arguments may not be NULL\n");

    size_t tag_size = s_bsmp->recv_tag_size();
    if ( tag == NULL && tag_size  > 0 )
        bsp_abort("bsp_get_tag: tag must point to a block of available "
                "memory of at least %zu bytes long\n", tag_size );

    if ( s_bsmp->empty() ) {
        *status = bsp_size_t(-1);
    }
    else {
        *status = static_cast<bsp_size_t>( s_bsmp->payload_size() );
        std::memcpy( tag, s_bsmp->tag(), tag_size );
    }
}